

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * CreateReturn(ExpressionContext *ctx,SynBase *source,ExprBase *result)

{
  TypeBase *pTVar1;
  bool bVar2;
  FunctionData *pFVar3;
  ExprReturn *this;
  ExprError *pEVar4;
  TypeBase *pTVar5;
  TypeFunction *pTVar6;
  ExprBase *value;
  ExprBase *coroutineStateUpdate;
  SynBase *pSVar7;
  ExprBase *closures;
  TypeBase *local_40;
  TypeBase *returnType;
  FunctionData *function_1;
  FunctionData *function;
  ExprBase *result_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  bVar2 = isType<TypeError>(result->type);
  if (bVar2) {
    pFVar3 = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
    if (pFVar3 != (FunctionData *)0x0) {
      pFVar3->hasExplicitReturn = true;
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprReturn>(ctx);
    ExprReturn::ExprReturn
              ((ExprReturn *)ctx_local,source,result->type,result,(ExprBase *)0x0,(ExprBase *)0x0);
  }
  else {
    pFVar3 = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
    if (pFVar3 == (FunctionData *)0x0) {
      bVar2 = isType<TypeFunction>(result->type);
      function = (FunctionData *)result;
      if (bVar2) {
        function = (FunctionData *)CreateCast(ctx,source,result,result->type,false);
      }
      bVar2 = AssertValueExpression(ctx,*(SynBase **)&function->isInternal,(ExprBase *)function);
      if (bVar2) {
        bVar2 = ExpressionContext::IsNumericType(ctx,(TypeBase *)function->scope);
        if ((!bVar2) && (bVar2 = isType<TypeEnum>((TypeBase *)function->scope), !bVar2)) {
          anon_unknown.dwarf_6f1cc::Report
                    (ctx,source,"ERROR: global return cannot accept \'%.*s\'",
                     (ulong)(uint)((int)function->scope->ownerFunction -
                                  (int)function->scope->ownerNamespace),
                     function->scope->ownerNamespace);
        }
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprReturn>(ctx);
        ExprReturn::ExprReturn
                  ((ExprReturn *)ctx_local,source,ctx->typeVoid,(ExprBase *)function,(ExprBase *)0x0
                   ,(ExprBase *)0x0);
      }
      else {
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprReturn>(ctx);
        pTVar1 = ctx->typeVoid;
        pEVar4 = ExpressionContext::get<ExprError>(ctx);
        pSVar7 = *(SynBase **)&function->isInternal;
        pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprError::ExprError(pEVar4,pSVar7,pTVar5,(ExprBase *)function,(ExprBase *)0x0);
        ExprReturn::ExprReturn
                  ((ExprReturn *)ctx_local,source,pTVar1,&pEVar4->super_ExprBase,(ExprBase *)0x0,
                   (ExprBase *)0x0);
      }
    }
    else {
      local_40 = pFVar3->type->returnType;
      if (local_40 == ctx->typeAuto) {
        bVar2 = AssertValueExpression(ctx,source,result);
        if (!bVar2) {
          this = ExpressionContext::get<ExprReturn>(ctx);
          pTVar1 = ctx->typeVoid;
          pEVar4 = ExpressionContext::get<ExprError>(ctx);
          pSVar7 = result->source;
          pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          ExprError::ExprError(pEVar4,pSVar7,pTVar5,result,(ExprBase *)0x0);
          ExprReturn::ExprReturn
                    (this,source,pTVar1,&pEVar4->super_ExprBase,(ExprBase *)0x0,(ExprBase *)0x0);
          return &this->super_ExprBase;
        }
        local_40 = result->type;
        pTVar6 = ExpressionContext::GetFunctionType(ctx,source,local_40,pFVar3->type->arguments);
        pFVar3->type = pTVar6;
      }
      if ((local_40 == ctx->typeVoid) && (result->type != ctx->typeVoid)) {
        anon_unknown.dwarf_6f1cc::Report(ctx,source,"ERROR: \'void\' function returning a value");
      }
      if ((local_40 != ctx->typeVoid) && (result->type == ctx->typeVoid)) {
        anon_unknown.dwarf_6f1cc::Report
                  (ctx,source,"ERROR: function must return a value of type \'%.*s\'",
                   (ulong)(uint)((int)(local_40->name).end - (int)(local_40->name).begin));
      }
      value = CreateCast(ctx,source,result,pFVar3->type->returnType,false);
      pFVar3->hasExplicitReturn = true;
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprReturn>(ctx);
      pTVar1 = ctx->typeVoid;
      coroutineStateUpdate = CreateFunctionCoroutineStateUpdate(ctx,source,pFVar3,0);
      pSVar7 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      closures = CreateFunctionUpvalueClose(ctx,pSVar7,pFVar3,ctx->scope);
      ExprReturn::ExprReturn
                ((ExprReturn *)ctx_local,source,pTVar1,value,coroutineStateUpdate,closures);
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateReturn(ExpressionContext &ctx, SynBase *source, ExprBase *result)
{
	if(isType<TypeError>(result->type))
	{
		if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
			function->hasExplicitReturn = true;

		return new (ctx.get<ExprReturn>()) ExprReturn(source, result->type, result, NULL, NULL);
	}

	if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
	{
		TypeBase *returnType = function->type->returnType;

		// If return type is auto, set it to type that is being returned
		if(returnType == ctx.typeAuto)
		{
			if(!AssertValueExpression(ctx, source, result))
				return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

			returnType = result->type;

			function->type = ctx.GetFunctionType(source, returnType, function->type->arguments);
		}

		if(returnType == ctx.typeVoid && result->type != ctx.typeVoid)
			Report(ctx, source, "ERROR: 'void' function returning a value");
		if(returnType != ctx.typeVoid && result->type == ctx.typeVoid)
			Report(ctx, source, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		result = CreateCast(ctx, source, result, function->type->returnType, false);

		function->hasExplicitReturn = true;

		// TODO: checked return value

		return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, source, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope));
	}

	if(isType<TypeFunction>(result->type))
		result = CreateCast(ctx, source, result, result->type, false);

	if(!AssertValueExpression(ctx, result->source, result))
		return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

	if(!ctx.IsNumericType(result->type) && !isType<TypeEnum>(result->type))
		Report(ctx, source, "ERROR: global return cannot accept '%.*s'", FMT_ISTR(result->type->name));

	return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, NULL, NULL);
}